

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
kratos::Generator::copy_over_missing_ports(Generator *this,shared_ptr<kratos::Generator> *ref)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *param_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this_01;
  undefined1 auVar3 [8];
  char cVar4;
  byte bVar5;
  iterator iVar6;
  Port *this_02;
  _Base_ptr p_Var7;
  undefined1 local_b8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_78 [8];
  shared_ptr<kratos::Param> param;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_48 [8];
  shared_ptr<kratos::Port> port;
  
  port_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ref;
  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_b8,
             &(((ref->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              ports_)._M_t);
  if (port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      (_Rb_tree_node_base *)&port_names) {
    this_00 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
              0x13;
    p_Var2 = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             0x13;
    p_Var7 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,(key_type *)(p_Var7 + 1));
      if (iVar6._M_node == (_Base_ptr)&p_Var2->_M_use_count) {
        get_port((Generator *)local_48,
                 *(string **)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        this_02 = Generator::port((Generator *)
                                  port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,*(PortDirection *)((long)local_48 + 0x270),
                                  (string *)(p_Var7 + 1),*(uint32_t *)((long)local_48 + 0x98),
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  ((long)local_48 + 0xa0),*(PortType *)((long)local_48 + 0x274),
                                  *(bool *)((long)local_48 + 0xf0));
        auVar3 = local_48;
        if ((*(_func_int **)((long)local_48 + 0x1e8) != (_func_int *)0x0) &&
           (cVar4 = (**(code **)(*(long *)*(_func_int **)((long)local_48 + 0x1e8) + 0xd8))(),
           cVar4 != '\0')) {
          param_00 = &param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
          (**(code **)(*(long *)*(_func_int **)((long)auVar3 + 0x1e8) + 0xf8))(param_00);
          get_param((Generator *)local_78,
                    (string *)
                    port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
          if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              != &local_58) {
            operator_delete(param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,(long)local_58._vptr__Sp_counted_base + 1);
          }
          this_01 = param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (local_78 != (undefined1  [8])0x0) {
            param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78;
            if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pvVar1 = &((param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Const).super_Var.super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
                UNLOCK();
              }
              else {
                pvVar1 = &((param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->super_Const).super_Var.super_IRNode.fn_name_ln;
                *(int *)&(pvVar1->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                     *(int *)&(pvVar1->
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1;
              }
            }
            Var::set_width_param(&this_02->super_Var,(shared_ptr<kratos::Var> *)param_00);
            if (this_01 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
            }
          }
          if (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
        bVar5 = (**(code **)(*(_func_int **)local_48 + 0xc0))();
        (*(this_02->super_Var).super_IRNode._vptr_IRNode[0x19])(this_02,(ulong)bVar5);
        if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)&port_names);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  return;
}

Assistant:

void Generator::copy_over_missing_ports(const std::shared_ptr<Generator> &ref) {
    auto port_names = ref->get_port_names();
    for (auto const &port_name : port_names) {
        if (has_port(port_name)) continue;
        auto port = ref->get_port(port_name);
        auto &p = this->port(port->port_direction(), port_name, port->var_width(), port->size(),
                             port->port_type(), port->is_signed());
        if (port->width_param() && port->width_param()->is_param()) {
            auto param = this->get_param(port->width_param()->to_string());
            if (param) {
                p.set_width_param(param);
            }
        }
        p.set_is_packed(port->is_packed());
    }
}